

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

void print_version(lua_State *L)

{
  char *__s;
  size_t len;
  
  ravi_writestring(L,
                   "Ravi 5.3.5\nCopyright (C) 1994-2019 Lua.org, PUC-Rio\nPortions Copyright (C) 2015-2024 Dibyendu Majumdar"
                   ,0x66);
  __s = raviV_options(L);
  ravi_writeline(L);
  ravi_writestring(L,"Options ",8);
  len = strlen(__s);
  ravi_writestring(L,__s,len);
  ravi_writeline(L);
  return;
}

Assistant:

static void print_version (lua_State *L) {
  lua_writestring(LUA_COPYRIGHT, strlen(LUA_COPYRIGHT));
  const char *options = raviV_options(L);
  lua_writeline();
#define OPTSTR "Options "
  lua_writestring(OPTSTR, strlen(OPTSTR));
#undef OPTSTR
  lua_writestring(options, strlen(options));
  lua_writeline();
}